

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O1

bool __thiscall ezexample::ensure_ns_exists(ezexample *this,char c)

{
  bool bVar1;
  uchar local_11;
  
  if ((this->vw_ref->ignore_some != true) || (bVar1 = true, this->vw_ref->ignore[c] == false)) {
    if (this->ns_exists[c] == false) {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)this->ec,&local_11);
      this->ns_exists[c] = true;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ensure_ns_exists(char c)  // returns TRUE iff we should ignore it :)
  {
    if (vw_ref->ignore_some && vw_ref->ignore[(int)c])
      return true;
    if (ns_exists[(int)c])
      return false;
    ec->indices.push_back((size_t)c);
    ns_exists[(int)c] = true;
    return false;
  }